

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O1

void proto2_unittest::TestAllTypesLite::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  _func_int **pp_Var6;
  void *pvVar7;
  MessageLite *pMVar8;
  Nonnull<const_char_*> pcVar9;
  Arena *extraout_RDX;
  Arena *pAVar10;
  string *psVar11;
  InternalMetadata *this;
  InternalMetadata *pIVar12;
  Arena *arena;
  
  pIVar12 = (InternalMetadata *)&stack0xffffffffffffffc8;
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    pcVar9 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar9 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar9 != (Nonnull<const_char_*>)0x0) {
    MergeImpl();
  }
  google::protobuf::RepeatedField<int>::MergeFrom
            ((RepeatedField<int> *)(to_msg + 2),(RepeatedField<int> *)(from_msg + 2));
  google::protobuf::RepeatedField<long>::MergeFrom
            ((RepeatedField<long> *)(to_msg + 3),(RepeatedField<long> *)(from_msg + 3));
  google::protobuf::RepeatedField<unsigned_int>::MergeFrom
            ((RepeatedField<unsigned_int> *)(to_msg + 4),
             (RepeatedField<unsigned_int> *)(from_msg + 4));
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom
            ((RepeatedField<unsigned_long> *)(to_msg + 5),
             (RepeatedField<unsigned_long> *)(from_msg + 5));
  google::protobuf::RepeatedField<int>::MergeFrom
            ((RepeatedField<int> *)(to_msg + 6),(RepeatedField<int> *)(from_msg + 6));
  google::protobuf::RepeatedField<long>::MergeFrom
            ((RepeatedField<long> *)(to_msg + 7),(RepeatedField<long> *)(from_msg + 7));
  google::protobuf::RepeatedField<unsigned_int>::MergeFrom
            ((RepeatedField<unsigned_int> *)(to_msg + 8),
             (RepeatedField<unsigned_int> *)(from_msg + 8));
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom
            ((RepeatedField<unsigned_long> *)(to_msg + 9),
             (RepeatedField<unsigned_long> *)(from_msg + 9));
  google::protobuf::RepeatedField<int>::MergeFrom
            ((RepeatedField<int> *)(to_msg + 10),(RepeatedField<int> *)(from_msg + 10));
  google::protobuf::RepeatedField<long>::MergeFrom
            ((RepeatedField<long> *)(to_msg + 0xb),(RepeatedField<long> *)(from_msg + 0xb));
  google::protobuf::RepeatedField<float>::MergeFrom
            ((RepeatedField<float> *)(to_msg + 0xc),(RepeatedField<float> *)(from_msg + 0xc));
  google::protobuf::RepeatedField<double>::MergeFrom
            ((RepeatedField<double> *)(to_msg + 0xd),(RepeatedField<double> *)(from_msg + 0xd));
  google::protobuf::RepeatedField<bool>::MergeFrom
            ((RepeatedField<bool> *)(to_msg + 0xe),(RepeatedField<bool> *)(from_msg + 0xe));
  if ((int)from_msg[0xf]._internal_metadata_.ptr_ != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
              ((RepeatedPtrFieldBase *)(to_msg + 0xf),(RepeatedPtrFieldBase *)(from_msg + 0xf));
  }
  if (*(int *)&from_msg[0x11]._vptr_MessageLite != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
              ((RepeatedPtrFieldBase *)&to_msg[0x10]._internal_metadata_,
               (RepeatedPtrFieldBase *)&from_msg[0x10]._internal_metadata_);
  }
  if ((int)from_msg[0x12]._internal_metadata_.ptr_ != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<google::protobuf::MessageLite>
              ((RepeatedPtrFieldBase *)(to_msg + 0x12),(RepeatedPtrFieldBase *)(from_msg + 0x12));
  }
  if (*(int *)&from_msg[0x14]._vptr_MessageLite != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<google::protobuf::MessageLite>
              ((RepeatedPtrFieldBase *)&to_msg[0x13]._internal_metadata_,
               (RepeatedPtrFieldBase *)&from_msg[0x13]._internal_metadata_);
  }
  if ((int)from_msg[0x15]._internal_metadata_.ptr_ != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<google::protobuf::MessageLite>
              ((RepeatedPtrFieldBase *)(to_msg + 0x15),(RepeatedPtrFieldBase *)(from_msg + 0x15));
  }
  if (*(int *)&from_msg[0x17]._vptr_MessageLite != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<google::protobuf::MessageLite>
              ((RepeatedPtrFieldBase *)&to_msg[0x16]._internal_metadata_,
               (RepeatedPtrFieldBase *)&from_msg[0x16]._internal_metadata_);
  }
  google::protobuf::RepeatedField<int>::MergeFrom
            ((RepeatedField<int> *)(to_msg + 0x18),(RepeatedField<int> *)(from_msg + 0x18));
  google::protobuf::RepeatedField<int>::MergeFrom
            ((RepeatedField<int> *)(to_msg + 0x19),(RepeatedField<int> *)(from_msg + 0x19));
  google::protobuf::RepeatedField<int>::MergeFrom
            ((RepeatedField<int> *)(to_msg + 0x1a),(RepeatedField<int> *)(from_msg + 0x1a));
  if ((int)from_msg[0x1b]._internal_metadata_.ptr_ != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
              ((RepeatedPtrFieldBase *)(to_msg + 0x1b),(RepeatedPtrFieldBase *)(from_msg + 0x1b));
  }
  if (*(int *)&from_msg[0x1d]._vptr_MessageLite != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
              ((RepeatedPtrFieldBase *)&to_msg[0x1c]._internal_metadata_,
               (RepeatedPtrFieldBase *)&from_msg[0x1c]._internal_metadata_);
  }
  if ((int)from_msg[0x1e]._internal_metadata_.ptr_ != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<google::protobuf::MessageLite>
              ((RepeatedPtrFieldBase *)(to_msg + 0x1e),(RepeatedPtrFieldBase *)(from_msg + 0x1e));
  }
  uVar2 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((char)uVar2 == '\0') goto LAB_001d7f09;
  if ((uVar2 & 1) != 0) {
    uVar5 = from_msg[0x1f]._internal_metadata_.ptr_;
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
    pAVar10 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar10 & 1) != 0) {
      pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
    }
    google::protobuf::internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)&to_msg[0x1f]._internal_metadata_,
               (string *)(uVar5 & 0xfffffffffffffffc),pAVar10);
  }
  if ((uVar2 & 2) != 0) {
    pp_Var6 = from_msg[0x20]._vptr_MessageLite;
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 2;
    pAVar10 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar10 & 1) != 0) {
      pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
    }
    google::protobuf::internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)(to_msg + 0x20),(string *)((ulong)pp_Var6 & 0xfffffffffffffffc),
               pAVar10);
  }
  if ((uVar2 & 4) != 0) {
    uVar5 = from_msg[0x20]._internal_metadata_.ptr_;
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 4;
    pAVar10 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar10 & 1) != 0) {
      pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
    }
    google::protobuf::internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)&to_msg[0x20]._internal_metadata_,
               (string *)(uVar5 & 0xfffffffffffffffc),pAVar10);
  }
  if ((uVar2 & 8) != 0) {
    pp_Var6 = from_msg[0x21]._vptr_MessageLite;
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 8;
    pAVar10 = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)pAVar10 & 1) != 0) {
      pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
    }
    google::protobuf::internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)(to_msg + 0x21),(string *)((ulong)pp_Var6 & 0xfffffffffffffffc),
               pAVar10);
  }
  if ((uVar2 & 0x10) == 0) {
LAB_001d7e62:
    if ((uVar2 & 0x20) != 0) {
      psVar11 = (string *)from_msg[0x22]._vptr_MessageLite;
      if (psVar11 == (string *)0x0) goto LAB_001d84e9;
      if ((MessageLite *)to_msg[0x22]._vptr_MessageLite == (MessageLite *)0x0) {
        pp_Var6 = (_func_int **)
                  google::protobuf::Arena::
                  CopyConstruct<proto2_unittest::TestAllTypesLite_NestedMessage>(arena,psVar11);
        to_msg[0x22]._vptr_MessageLite = pp_Var6;
      }
      else {
        TestAllTypesLite_NestedMessage::MergeImpl
                  ((MessageLite *)to_msg[0x22]._vptr_MessageLite,(MessageLite *)psVar11);
      }
    }
    if ((uVar2 & 0x40) != 0) {
      psVar11 = (string *)from_msg[0x22]._internal_metadata_.ptr_;
      if (psVar11 == (string *)0x0) goto LAB_001d84f1;
      pMVar8 = (MessageLite *)to_msg[0x22]._internal_metadata_.ptr_;
      if (pMVar8 == (MessageLite *)0x0) {
        pvVar7 = google::protobuf::Arena::CopyConstruct<proto2_unittest::ForeignMessageLite>
                           (arena,psVar11);
        to_msg[0x22]._internal_metadata_.ptr_ = (intptr_t)pvVar7;
      }
      else {
        ForeignMessageLite::MergeImpl(pMVar8,(MessageLite *)psVar11);
      }
    }
    if ((char)uVar2 < '\0') {
      psVar11 = (string *)from_msg[0x23]._vptr_MessageLite;
      if (psVar11 != (string *)0x0) {
        if ((MessageLite *)to_msg[0x23]._vptr_MessageLite == (MessageLite *)0x0) {
          pp_Var6 = (_func_int **)
                    google::protobuf::Arena::
                    CopyConstruct<proto2_unittest_import::ImportMessageLite>(arena,psVar11);
          to_msg[0x23]._vptr_MessageLite = pp_Var6;
        }
        else {
          proto2_unittest_import::ImportMessageLite::MergeImpl
                    ((MessageLite *)to_msg[0x23]._vptr_MessageLite,(MessageLite *)psVar11);
        }
        goto LAB_001d7f09;
      }
      goto LAB_001d8501;
    }
LAB_001d7f09:
    if ((uVar2 & 0xff00) != 0) {
      if ((uVar2 >> 8 & 1) != 0) {
        psVar11 = (string *)from_msg[0x23]._internal_metadata_.ptr_;
        if (psVar11 == (string *)0x0) goto LAB_001d84f9;
        pMVar8 = (MessageLite *)to_msg[0x23]._internal_metadata_.ptr_;
        if (pMVar8 == (MessageLite *)0x0) {
          pvVar7 = google::protobuf::Arena::
                   CopyConstruct<proto2_unittest_import::PublicImportMessageLite>(arena,psVar11);
          to_msg[0x23]._internal_metadata_.ptr_ = (intptr_t)pvVar7;
        }
        else {
          proto2_unittest_import::PublicImportMessageLite::MergeImpl(pMVar8,(MessageLite *)psVar11);
        }
      }
      if ((uVar2 >> 9 & 1) != 0) {
        psVar11 = (string *)from_msg[0x24]._vptr_MessageLite;
        if (psVar11 != (string *)0x0) {
          if ((MessageLite *)to_msg[0x24]._vptr_MessageLite == (MessageLite *)0x0) {
            pp_Var6 = (_func_int **)
                      google::protobuf::Arena::
                      CopyConstruct<proto2_unittest::TestAllTypesLite_NestedMessage>(arena,psVar11);
            to_msg[0x24]._vptr_MessageLite = pp_Var6;
          }
          else {
            TestAllTypesLite_NestedMessage::MergeImpl
                      ((MessageLite *)to_msg[0x24]._vptr_MessageLite,(MessageLite *)psVar11);
          }
          goto LAB_001d7f85;
        }
        goto LAB_001d8509;
      }
LAB_001d7f85:
      if ((uVar2 >> 10 & 1) == 0) {
LAB_001d7fbd:
        if ((uVar2 >> 0xb & 1) != 0) {
          to_msg[0x25]._vptr_MessageLite = from_msg[0x25]._vptr_MessageLite;
        }
        if ((uVar2 >> 0xc & 1) != 0) {
          *(int *)&to_msg[0x25]._internal_metadata_.ptr_ =
               (int)from_msg[0x25]._internal_metadata_.ptr_;
        }
        if ((uVar2 >> 0xd & 1) != 0) {
          *(undefined4 *)((long)&to_msg[0x25]._internal_metadata_.ptr_ + 4) =
               *(undefined4 *)((long)&from_msg[0x25]._internal_metadata_.ptr_ + 4);
        }
        if ((uVar2 >> 0xe & 1) != 0) {
          to_msg[0x26]._vptr_MessageLite = from_msg[0x26]._vptr_MessageLite;
        }
        if ((short)uVar2 < 0) {
          to_msg[0x26]._internal_metadata_.ptr_ = from_msg[0x26]._internal_metadata_.ptr_;
        }
        goto LAB_001d801e;
      }
      psVar11 = (string *)from_msg[0x24]._internal_metadata_.ptr_;
      if (psVar11 != (string *)0x0) {
        pMVar8 = (MessageLite *)to_msg[0x24]._internal_metadata_.ptr_;
        if (pMVar8 == (MessageLite *)0x0) {
          pvVar7 = google::protobuf::Arena::
                   CopyConstruct<proto2_unittest::TestAllTypesLite_NestedMessage>(arena,psVar11);
          to_msg[0x24]._internal_metadata_.ptr_ = (intptr_t)pvVar7;
        }
        else {
          TestAllTypesLite_NestedMessage::MergeImpl(pMVar8,(MessageLite *)psVar11);
        }
        goto LAB_001d7fbd;
      }
      goto LAB_001d8511;
    }
LAB_001d801e:
    if ((uVar2 & 0xff0000) != 0) {
      if ((uVar2 >> 0x10 & 1) != 0) {
        *(undefined4 *)&to_msg[0x27]._vptr_MessageLite =
             *(undefined4 *)&from_msg[0x27]._vptr_MessageLite;
      }
      if ((uVar2 >> 0x11 & 1) != 0) {
        *(undefined4 *)((long)&to_msg[0x27]._vptr_MessageLite + 4) =
             *(undefined4 *)((long)&from_msg[0x27]._vptr_MessageLite + 4);
      }
      if ((uVar2 >> 0x12 & 1) != 0) {
        to_msg[0x27]._internal_metadata_.ptr_ = from_msg[0x27]._internal_metadata_.ptr_;
      }
      if ((uVar2 >> 0x13 & 1) != 0) {
        to_msg[0x28]._vptr_MessageLite = from_msg[0x28]._vptr_MessageLite;
      }
      if ((uVar2 >> 0x14 & 1) != 0) {
        *(int *)&to_msg[0x28]._internal_metadata_.ptr_ =
             (int)from_msg[0x28]._internal_metadata_.ptr_;
      }
      if ((uVar2 >> 0x15 & 1) != 0) {
        *(undefined4 *)((long)&to_msg[0x28]._internal_metadata_.ptr_ + 4) =
             *(undefined4 *)((long)&from_msg[0x28]._internal_metadata_.ptr_ + 4);
      }
      if ((uVar2 >> 0x16 & 1) != 0) {
        to_msg[0x29]._vptr_MessageLite = from_msg[0x29]._vptr_MessageLite;
      }
      if ((uVar2 >> 0x17 & 1) != 0) {
        *(char *)&to_msg[0x29]._internal_metadata_.ptr_ =
             (char)from_msg[0x29]._internal_metadata_.ptr_;
      }
    }
    if (0xffffff < uVar2) {
      if ((uVar2 >> 0x18 & 1) != 0) {
        *(undefined4 *)((long)&to_msg[0x29]._internal_metadata_.ptr_ + 4) =
             *(undefined4 *)((long)&from_msg[0x29]._internal_metadata_.ptr_ + 4);
      }
      if ((uVar2 >> 0x19 & 1) != 0) {
        *(undefined4 *)&to_msg[0x2a]._vptr_MessageLite =
             *(undefined4 *)&from_msg[0x2a]._vptr_MessageLite;
      }
      if ((uVar2 >> 0x1a & 1) != 0) {
        *(undefined4 *)((long)&to_msg[0x2a]._vptr_MessageLite + 4) =
             *(undefined4 *)((long)&from_msg[0x2a]._vptr_MessageLite + 4);
      }
      if ((uVar2 >> 0x1b & 1) != 0) {
        uVar5 = from_msg[0x2a]._internal_metadata_.ptr_;
        *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 0x8000000;
        psVar11 = (string *)(uVar5 & 0xfffffffffffffffc);
        pIVar12 = &to_msg[0x2a]._internal_metadata_;
        pAVar10 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar10 & 1) != 0) goto LAB_001d8519;
        goto LAB_001d813d;
      }
      goto LAB_001d8142;
    }
  }
  else {
    psVar11 = (string *)from_msg[0x21]._internal_metadata_.ptr_;
    if (psVar11 != (string *)0x0) {
      pMVar8 = (MessageLite *)to_msg[0x21]._internal_metadata_.ptr_;
      if (pMVar8 == (MessageLite *)0x0) {
        pvVar7 = google::protobuf::Arena::
                 CopyConstruct<proto2_unittest::TestAllTypesLite_OptionalGroup>(arena,psVar11);
        to_msg[0x21]._internal_metadata_.ptr_ = (intptr_t)pvVar7;
      }
      else {
        TestAllTypesLite_OptionalGroup::MergeImpl(pMVar8,(MessageLite *)psVar11);
      }
      goto LAB_001d7e62;
    }
    MergeImpl((TestAllTypesLite *)&stack0xffffffffffffffc8);
LAB_001d84e9:
    MergeImpl((TestAllTypesLite *)&stack0xffffffffffffffc8);
LAB_001d84f1:
    MergeImpl((TestAllTypesLite *)&stack0xffffffffffffffc8);
LAB_001d84f9:
    MergeImpl((TestAllTypesLite *)&stack0xffffffffffffffc8);
LAB_001d8501:
    MergeImpl((TestAllTypesLite *)&stack0xffffffffffffffc8);
LAB_001d8509:
    MergeImpl((TestAllTypesLite *)&stack0xffffffffffffffc8);
LAB_001d8511:
    MergeImpl((TestAllTypesLite *)&stack0xffffffffffffffc8);
    pAVar10 = extraout_RDX;
LAB_001d8519:
    pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
LAB_001d813d:
    google::protobuf::internal::ArenaStringPtr::Set<>((ArenaStringPtr *)pIVar12,psVar11,pAVar10);
LAB_001d8142:
    if ((uVar2 >> 0x1c & 1) != 0) {
      pp_Var6 = from_msg[0x2b]._vptr_MessageLite;
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 0x10000000;
      pAVar10 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar10 & 1) != 0) {
        pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set<>
                ((ArenaStringPtr *)(to_msg + 0x2b),(string *)((ulong)pp_Var6 & 0xfffffffffffffffc),
                 pAVar10);
    }
    if ((uVar2 >> 0x1d & 1) != 0) {
      uVar5 = from_msg[0x2b]._internal_metadata_.ptr_;
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 0x20000000;
      pAVar10 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar10 & 1) != 0) {
        pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set<>
                ((ArenaStringPtr *)&to_msg[0x2b]._internal_metadata_,
                 (string *)(uVar5 & 0xfffffffffffffffc),pAVar10);
    }
    if ((uVar2 >> 0x1e & 1) != 0) {
      pp_Var6 = from_msg[0x2c]._vptr_MessageLite;
      *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 0x40000000;
      pAVar10 = (Arena *)(to_msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar10 & 1) != 0) {
        pAVar10 = *(Arena **)((ulong)pAVar10 & 0xfffffffffffffffe);
      }
      google::protobuf::internal::ArenaStringPtr::Set<>
                ((ArenaStringPtr *)(to_msg + 0x2c),(string *)((ulong)pp_Var6 & 0xfffffffffffffffc),
                 pAVar10);
    }
    if (((int)uVar2 < 0) &&
       (pbVar1 = (byte *)((long)&to_msg[1]._vptr_MessageLite + 3), *pbVar1 = *pbVar1 | 0x80,
       to_msg != from_msg)) {
      pIVar12 = &from_msg[0x2c]._internal_metadata_;
      this = &to_msg[0x2c]._internal_metadata_;
      if (((this->ptr_ & 1) == 0) && ((pIVar12->ptr_ & 1) == 0)) {
        pp_Var6 = from_msg[0x2d]._vptr_MessageLite;
        this->ptr_ = pIVar12->ptr_;
        to_msg[0x2d]._vptr_MessageLite = pp_Var6;
      }
      else {
        absl::lts_20250127::Cord::InlineRep::AssignSlow((InlineRep *)this,(InlineRep *)pIVar12);
      }
    }
  }
  uVar2 = *(uint *)((long)&from_msg[1]._vptr_MessageLite + 4);
  if ((char)uVar2 != '\0') {
    if ((uVar2 & 1) != 0) {
      *(int *)&to_msg[0x2d]._internal_metadata_.ptr_ = (int)from_msg[0x2d]._internal_metadata_.ptr_;
    }
    if ((uVar2 & 2) != 0) {
      to_msg[0x2e]._vptr_MessageLite = from_msg[0x2e]._vptr_MessageLite;
    }
    if ((uVar2 & 4) != 0) {
      *(int *)&to_msg[0x2e]._internal_metadata_.ptr_ = (int)from_msg[0x2e]._internal_metadata_.ptr_;
    }
    if ((uVar2 & 8) != 0) {
      *(undefined4 *)((long)&to_msg[0x2e]._internal_metadata_.ptr_ + 4) =
           *(undefined4 *)((long)&from_msg[0x2e]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar2 & 0x10) != 0) {
      to_msg[0x2f]._vptr_MessageLite = from_msg[0x2f]._vptr_MessageLite;
    }
    if ((uVar2 & 0x20) != 0) {
      to_msg[0x2f]._internal_metadata_.ptr_ = from_msg[0x2f]._internal_metadata_.ptr_;
    }
    if ((uVar2 & 0x40) != 0) {
      *(undefined4 *)&to_msg[0x30]._vptr_MessageLite =
           *(undefined4 *)&from_msg[0x30]._vptr_MessageLite;
    }
    if ((char)uVar2 < '\0') {
      *(undefined4 *)((long)&to_msg[0x30]._vptr_MessageLite + 4) =
           *(undefined4 *)((long)&from_msg[0x30]._vptr_MessageLite + 4);
    }
  }
  if ((uVar2 & 0xff00) != 0) {
    if ((uVar2 >> 8 & 1) != 0) {
      to_msg[0x30]._internal_metadata_.ptr_ = from_msg[0x30]._internal_metadata_.ptr_;
    }
    if ((uVar2 >> 9 & 1) != 0) {
      to_msg[0x31]._vptr_MessageLite = from_msg[0x31]._vptr_MessageLite;
    }
    if ((uVar2 >> 10 & 1) != 0) {
      *(int *)&to_msg[0x31]._internal_metadata_.ptr_ = (int)from_msg[0x31]._internal_metadata_.ptr_;
    }
    if ((uVar2 >> 0xb & 1) != 0) {
      *(undefined4 *)((long)&to_msg[0x31]._internal_metadata_.ptr_ + 4) =
           *(undefined4 *)((long)&from_msg[0x31]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar2 >> 0xc & 1) != 0) {
      to_msg[0x32]._vptr_MessageLite = from_msg[0x32]._vptr_MessageLite;
    }
    if ((uVar2 >> 0xd & 1) != 0) {
      *(char *)&to_msg[0x32]._internal_metadata_.ptr_ =
           (char)from_msg[0x32]._internal_metadata_.ptr_;
    }
    if ((uVar2 >> 0xe & 1) != 0) {
      *(undefined4 *)((long)&to_msg[0x32]._internal_metadata_.ptr_ + 4) =
           *(undefined4 *)((long)&from_msg[0x32]._internal_metadata_.ptr_ + 4);
    }
    if ((short)uVar2 < 0) {
      *(undefined4 *)&to_msg[0x33]._vptr_MessageLite =
           *(undefined4 *)&from_msg[0x33]._vptr_MessageLite;
    }
  }
  if ((uVar2 >> 0x10 & 1) != 0) {
    *(undefined4 *)((long)&to_msg[0x33]._vptr_MessageLite + 4) =
         *(undefined4 *)((long)&from_msg[0x33]._vptr_MessageLite + 4);
  }
  to_msg[1]._vptr_MessageLite =
       (_func_int **)((ulong)to_msg[1]._vptr_MessageLite | (ulong)from_msg[1]._vptr_MessageLite);
  iVar3 = *(int *)&from_msg[0x34]._vptr_MessageLite;
  if (iVar3 == 0) goto switchD_001d83ad_caseD_74;
  iVar4 = *(int *)&to_msg[0x34]._vptr_MessageLite;
  if (iVar4 != iVar3) {
    if (iVar4 != 0) {
      clear_oneof_field((TestAllTypesLite *)to_msg);
    }
    *(int *)&to_msg[0x34]._vptr_MessageLite = iVar3;
  }
  switch(iVar3) {
  case 0x6f:
    *(int *)&to_msg[0x33]._internal_metadata_.ptr_ = (int)from_msg[0x33]._internal_metadata_.ptr_;
    break;
  case 0x70:
  case 0x73:
  case 0x75:
    if (iVar4 == iVar3) {
      google::protobuf::MessageLite::CheckTypeAndMergeFrom
                ((MessageLite *)to_msg[0x33]._internal_metadata_.ptr_,
                 (MessageLite *)from_msg[0x33]._internal_metadata_.ptr_);
    }
    else {
      pMVar8 = google::protobuf::MessageLite::CopyConstruct
                         (arena,(MessageLite *)from_msg[0x33]._internal_metadata_.ptr_);
      to_msg[0x33]._internal_metadata_.ptr_ = (intptr_t)pMVar8;
    }
    break;
  case 0x71:
    if (iVar4 != iVar3) {
      to_msg[0x33]._internal_metadata_.ptr_ =
           (intptr_t)&google::protobuf::internal::fixed_address_empty_string;
    }
    if (*(int *)&from_msg[0x34]._vptr_MessageLite != 0x71) goto LAB_001d8408;
LAB_001d8444:
    psVar11 = (string *)(from_msg[0x33]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    goto LAB_001d844f;
  case 0x72:
    if (iVar4 != iVar3) {
      to_msg[0x33]._internal_metadata_.ptr_ =
           (intptr_t)&google::protobuf::internal::fixed_address_empty_string;
    }
    if (*(int *)&from_msg[0x34]._vptr_MessageLite == 0x72) goto LAB_001d8444;
LAB_001d8408:
    psVar11 = (string *)&google::protobuf::internal::fixed_address_empty_string;
LAB_001d844f:
    google::protobuf::internal::ArenaStringPtr::Set<>
              ((ArenaStringPtr *)&to_msg[0x33]._internal_metadata_,psVar11,arena);
  }
switchD_001d83ad_caseD_74:
  uVar5 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar5 & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
            (&to_msg->_internal_metadata_,(string *)((uVar5 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void TestAllTypesLite::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestAllTypesLite*>(&to_msg);
  auto& from = static_cast<const TestAllTypesLite&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestAllTypesLite)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_int32()->MergeFrom(from._internal_repeated_int32());
  _this->_internal_mutable_repeated_int64()->MergeFrom(from._internal_repeated_int64());
  _this->_internal_mutable_repeated_uint32()->MergeFrom(from._internal_repeated_uint32());
  _this->_internal_mutable_repeated_uint64()->MergeFrom(from._internal_repeated_uint64());
  _this->_internal_mutable_repeated_sint32()->MergeFrom(from._internal_repeated_sint32());
  _this->_internal_mutable_repeated_sint64()->MergeFrom(from._internal_repeated_sint64());
  _this->_internal_mutable_repeated_fixed32()->MergeFrom(from._internal_repeated_fixed32());
  _this->_internal_mutable_repeated_fixed64()->MergeFrom(from._internal_repeated_fixed64());
  _this->_internal_mutable_repeated_sfixed32()->MergeFrom(from._internal_repeated_sfixed32());
  _this->_internal_mutable_repeated_sfixed64()->MergeFrom(from._internal_repeated_sfixed64());
  _this->_internal_mutable_repeated_float()->MergeFrom(from._internal_repeated_float());
  _this->_internal_mutable_repeated_double()->MergeFrom(from._internal_repeated_double());
  _this->_internal_mutable_repeated_bool()->MergeFrom(from._internal_repeated_bool());
  _this->_internal_mutable_repeated_string()->MergeFrom(from._internal_repeated_string());
  _this->_internal_mutable_repeated_bytes()->MergeFrom(from._internal_repeated_bytes());
  _this->_internal_mutable_repeatedgroup()->MergeFrom(
      from._internal_repeatedgroup());
  _this->_internal_mutable_repeated_nested_message()->MergeFrom(
      from._internal_repeated_nested_message());
  _this->_internal_mutable_repeated_foreign_message()->MergeFrom(
      from._internal_repeated_foreign_message());
  _this->_internal_mutable_repeated_import_message()->MergeFrom(
      from._internal_repeated_import_message());
  _this->_internal_mutable_repeated_nested_enum()->MergeFrom(from._internal_repeated_nested_enum());
  _this->_internal_mutable_repeated_foreign_enum()->MergeFrom(from._internal_repeated_foreign_enum());
  _this->_internal_mutable_repeated_import_enum()->MergeFrom(from._internal_repeated_import_enum());
  _this->_internal_mutable_repeated_string_piece()->MergeFrom(from._internal_repeated_string_piece());
  _this->_internal_mutable_repeated_cord()->MergeFrom(from._internal_repeated_cord());
  _this->_internal_mutable_repeated_lazy_message()->MergeFrom(
      from._internal_repeated_lazy_message());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_optional_string(from._internal_optional_string());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_optional_bytes(from._internal_optional_bytes());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_optional_string_piece(from._internal_optional_string_piece());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_internal_set_optional_cord(from._internal_optional_cord());
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(from._impl_.optionalgroup_ != nullptr);
      if (_this->_impl_.optionalgroup_ == nullptr) {
        _this->_impl_.optionalgroup_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optionalgroup_);
      } else {
        _this->_impl_.optionalgroup_->MergeFrom(*from._impl_.optionalgroup_);
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      ABSL_DCHECK(from._impl_.optional_nested_message_ != nullptr);
      if (_this->_impl_.optional_nested_message_ == nullptr) {
        _this->_impl_.optional_nested_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optional_nested_message_);
      } else {
        _this->_impl_.optional_nested_message_->MergeFrom(*from._impl_.optional_nested_message_);
      }
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      ABSL_DCHECK(from._impl_.optional_foreign_message_ != nullptr);
      if (_this->_impl_.optional_foreign_message_ == nullptr) {
        _this->_impl_.optional_foreign_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optional_foreign_message_);
      } else {
        _this->_impl_.optional_foreign_message_->MergeFrom(*from._impl_.optional_foreign_message_);
      }
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      ABSL_DCHECK(from._impl_.optional_import_message_ != nullptr);
      if (_this->_impl_.optional_import_message_ == nullptr) {
        _this->_impl_.optional_import_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optional_import_message_);
      } else {
        _this->_impl_.optional_import_message_->MergeFrom(*from._impl_.optional_import_message_);
      }
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      ABSL_DCHECK(from._impl_.optional_public_import_message_ != nullptr);
      if (_this->_impl_.optional_public_import_message_ == nullptr) {
        _this->_impl_.optional_public_import_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optional_public_import_message_);
      } else {
        _this->_impl_.optional_public_import_message_->MergeFrom(*from._impl_.optional_public_import_message_);
      }
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      ABSL_DCHECK(from._impl_.optional_lazy_message_ != nullptr);
      if (_this->_impl_.optional_lazy_message_ == nullptr) {
        _this->_impl_.optional_lazy_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optional_lazy_message_);
      } else {
        _this->_impl_.optional_lazy_message_->MergeFrom(*from._impl_.optional_lazy_message_);
      }
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      ABSL_DCHECK(from._impl_.optional_unverified_lazy_message_ != nullptr);
      if (_this->_impl_.optional_unverified_lazy_message_ == nullptr) {
        _this->_impl_.optional_unverified_lazy_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.optional_unverified_lazy_message_);
      } else {
        _this->_impl_.optional_unverified_lazy_message_->MergeFrom(*from._impl_.optional_unverified_lazy_message_);
      }
    }
    if ((cached_has_bits & 0x00000800u) != 0) {
      _this->_impl_.optional_int64_ = from._impl_.optional_int64_;
    }
    if ((cached_has_bits & 0x00001000u) != 0) {
      _this->_impl_.optional_int32_ = from._impl_.optional_int32_;
    }
    if ((cached_has_bits & 0x00002000u) != 0) {
      _this->_impl_.optional_uint32_ = from._impl_.optional_uint32_;
    }
    if ((cached_has_bits & 0x00004000u) != 0) {
      _this->_impl_.optional_uint64_ = from._impl_.optional_uint64_;
    }
    if ((cached_has_bits & 0x00008000u) != 0) {
      _this->_impl_.optional_sint64_ = from._impl_.optional_sint64_;
    }
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    if ((cached_has_bits & 0x00010000u) != 0) {
      _this->_impl_.optional_sint32_ = from._impl_.optional_sint32_;
    }
    if ((cached_has_bits & 0x00020000u) != 0) {
      _this->_impl_.optional_fixed32_ = from._impl_.optional_fixed32_;
    }
    if ((cached_has_bits & 0x00040000u) != 0) {
      _this->_impl_.optional_fixed64_ = from._impl_.optional_fixed64_;
    }
    if ((cached_has_bits & 0x00080000u) != 0) {
      _this->_impl_.optional_sfixed64_ = from._impl_.optional_sfixed64_;
    }
    if ((cached_has_bits & 0x00100000u) != 0) {
      _this->_impl_.optional_sfixed32_ = from._impl_.optional_sfixed32_;
    }
    if ((cached_has_bits & 0x00200000u) != 0) {
      _this->_impl_.optional_float_ = from._impl_.optional_float_;
    }
    if ((cached_has_bits & 0x00400000u) != 0) {
      _this->_impl_.optional_double_ = from._impl_.optional_double_;
    }
    if ((cached_has_bits & 0x00800000u) != 0) {
      _this->_impl_.optional_bool_ = from._impl_.optional_bool_;
    }
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    if ((cached_has_bits & 0x01000000u) != 0) {
      _this->_impl_.optional_import_enum_ = from._impl_.optional_import_enum_;
    }
    if ((cached_has_bits & 0x02000000u) != 0) {
      _this->_impl_.optional_nested_enum_ = from._impl_.optional_nested_enum_;
    }
    if ((cached_has_bits & 0x04000000u) != 0) {
      _this->_impl_.optional_foreign_enum_ = from._impl_.optional_foreign_enum_;
    }
    if ((cached_has_bits & 0x08000000u) != 0) {
      _this->_internal_set_default_string(from._internal_default_string());
    }
    if ((cached_has_bits & 0x10000000u) != 0) {
      _this->_internal_set_default_bytes(from._internal_default_bytes());
    }
    if ((cached_has_bits & 0x20000000u) != 0) {
      _this->_internal_set_default_string_piece(from._internal_default_string_piece());
    }
    if ((cached_has_bits & 0x40000000u) != 0) {
      _this->_internal_set_default_cord(from._internal_default_cord());
    }
    if ((cached_has_bits & 0x80000000u) != 0) {
      _this->_internal_set_optional_bytes_cord(from._internal_optional_bytes_cord());
    }
  }
  cached_has_bits = from._impl_._has_bits_[1];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_impl_.deceptively_named_list_ = from._impl_.deceptively_named_list_;
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.default_int64_ = from._impl_.default_int64_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.default_int32_ = from._impl_.default_int32_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.default_uint32_ = from._impl_.default_uint32_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.default_uint64_ = from._impl_.default_uint64_;
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.default_sint64_ = from._impl_.default_sint64_;
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_impl_.default_sint32_ = from._impl_.default_sint32_;
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _this->_impl_.default_fixed32_ = from._impl_.default_fixed32_;
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      _this->_impl_.default_fixed64_ = from._impl_.default_fixed64_;
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      _this->_impl_.default_sfixed64_ = from._impl_.default_sfixed64_;
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      _this->_impl_.default_sfixed32_ = from._impl_.default_sfixed32_;
    }
    if ((cached_has_bits & 0x00000800u) != 0) {
      _this->_impl_.default_float_ = from._impl_.default_float_;
    }
    if ((cached_has_bits & 0x00001000u) != 0) {
      _this->_impl_.default_double_ = from._impl_.default_double_;
    }
    if ((cached_has_bits & 0x00002000u) != 0) {
      _this->_impl_.default_bool_ = from._impl_.default_bool_;
    }
    if ((cached_has_bits & 0x00004000u) != 0) {
      _this->_impl_.default_nested_enum_ = from._impl_.default_nested_enum_;
    }
    if ((cached_has_bits & 0x00008000u) != 0) {
      _this->_impl_.default_foreign_enum_ = from._impl_.default_foreign_enum_;
    }
  }
  if ((cached_has_bits & 0x00010000u) != 0) {
    _this->_impl_.default_import_enum_ = from._impl_.default_import_enum_;
  }
  _this->_impl_._has_bits_.Or(from._impl_._has_bits_);
  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_oneof_field();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kOneofUint32: {
        _this->_impl_.oneof_field_.oneof_uint32_ = from._impl_.oneof_field_.oneof_uint32_;
        break;
      }
      case kOneofNestedMessage: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_nested_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.oneof_field_.oneof_nested_message_);
        } else {
          _this->_impl_.oneof_field_.oneof_nested_message_->CheckTypeAndMergeFrom(*from._impl_.oneof_field_.oneof_nested_message_);
        }
        break;
      }
      case kOneofString: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_string_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_string_.Set(from._internal_oneof_string(), arena);
        break;
      }
      case kOneofBytes: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_bytes_.InitDefault();
        }
        _this->_impl_.oneof_field_.oneof_bytes_.Set(from._internal_oneof_bytes(), arena);
        break;
      }
      case kOneofLazyNestedMessage: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_lazy_nested_message_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.oneof_field_.oneof_lazy_nested_message_);
        } else {
          _this->_impl_.oneof_field_.oneof_lazy_nested_message_->CheckTypeAndMergeFrom(*from._impl_.oneof_field_.oneof_lazy_nested_message_);
        }
        break;
      }
      case kOneofNestedMessage2: {
        if (oneof_needs_init) {
          _this->_impl_.oneof_field_.oneof_nested_message2_ = ::google::protobuf::MessageLite::CopyConstruct(arena, *from._impl_.oneof_field_.oneof_nested_message2_);
        } else {
          _this->_impl_.oneof_field_.oneof_nested_message2_->CheckTypeAndMergeFrom(*from._impl_.oneof_field_.oneof_nested_message2_);
        }
        break;
      }
      case ONEOF_FIELD_NOT_SET:
        break;
    }
  }
  _this->_internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}